

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool prvTidyIsBlank(Lexer *lexer,Node *node)

{
  bool local_1e;
  bool local_1d;
  Bool local_1c;
  Bool isBlank;
  Node *node_local;
  Lexer *lexer_local;
  
  local_1c = prvTidynodeIsText(node);
  if (local_1c != no) {
    local_1d = true;
    if (node->end != node->start) {
      local_1e = false;
      if (node->end == node->start + 1) {
        local_1e = lexer->lexbuf[node->start] == ' ';
      }
      local_1d = local_1e;
    }
    local_1c = (Bool)local_1d;
  }
  return local_1c;
}

Assistant:

Bool TY_(IsBlank)(Lexer *lexer, Node *node)
{
    Bool isBlank = TY_(nodeIsText)(node);
    if ( isBlank )
        isBlank = ( node->end == node->start ||       /* Zero length */
                    ( node->end == node->start+1      /* or one blank. */
                      && lexer->lexbuf[node->start] == ' ' ) );
    return isBlank;
}